

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall
mp::NLFeeder_Easy::FeedColNames<mp::StringFileWriter>(NLFeeder_Easy *this,StringFileWriter *wrt)

{
  long lVar1;
  bool bVar2;
  
  if ((this->nlme_).var_names_ != (char **)0x0) {
    if (wrt->fTriedOpen_ == false) {
      bVar2 = StringFileWriter::Open(wrt);
    }
    else {
      bVar2 = (wrt->nm).f_ != (FILE *)0x0;
    }
    if ((bVar2 != false) && (0 < (this->nlme_).vars_.num_col_)) {
      lVar1 = 0;
      do {
        StringFileWriter::Write<char_const*>
                  (wrt,(this->nlme_).var_names_
                       [(this->var_perm_).
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar1].second]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < (this->nlme_).vars_.num_col_);
    }
  }
  return;
}

Assistant:

void FeedColNames(ColNameWriter& wrt) {
    if (NLME().ColNames() && wrt) {
      for (int i=0; i<NLME().NumCols(); ++i)
        wrt << NLME().ColNames()[VPermInv(i)];
    }
  }